

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O0

shared_ptr<const_Assimp::FIValue> __thiscall
Assimp::FIUUIDDecoder::decode(FIUUIDDecoder *this,uint8_t *data,size_t len)

{
  DeadlyImportError *this_00;
  ulong in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<const_Assimp::FIValue> sVar1;
  allocator<unsigned_char> local_61;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_60;
  FIUUIDValue local_48;
  size_t len_local;
  uint8_t *data_local;
  FIUUIDDecoder *this_local;
  
  len_local = len;
  data_local = data;
  this_local = this;
  if ((in_RCX & 0xf) != 0) {
    this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    DeadlyImportError::DeadlyImportError(this_00,(string *)parseErrorMessage_abi_cxx11_);
    __cxa_throw(this_00,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  std::allocator<unsigned_char>::allocator(&local_61);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_60,(uchar *)len,
             (uchar *)(len + in_RCX),&local_61);
  FIUUIDValue::create(&local_48,&local_60);
  std::shared_ptr<Assimp::FIValue_const>::shared_ptr<Assimp::FIUUIDValue,void>
            ((shared_ptr<Assimp::FIValue_const> *)this,(shared_ptr<Assimp::FIUUIDValue> *)&local_48)
  ;
  std::shared_ptr<Assimp::FIUUIDValue>::~shared_ptr((shared_ptr<Assimp::FIUUIDValue> *)&local_48);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_60);
  std::allocator<unsigned_char>::~allocator(&local_61);
  sVar1.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<const_Assimp::FIValue>)
         sVar1.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

virtual std::shared_ptr<const FIValue> decode(const uint8_t *data, size_t len) /*override*/ {
        if (len & 15) {
            throw DeadlyImportError(parseErrorMessage);
        }
        return FIUUIDValue::create(std::vector<uint8_t>(data, data + len));
    }